

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
cmGeneratorTarget::GetIncludeDirectories
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,cmGeneratorTarget *this,string *config,string *lang)

{
  cmTarget *pcVar1;
  cmMakefile *pcVar2;
  Snapshot snapshot;
  auto_ptr<cmCompiledGeneratorExpression> aVar3;
  bool bVar4;
  int iVar5;
  char *__s;
  size_t sVar6;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var7;
  cmLinkImplementationLibraries *pcVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  pointer in_relative;
  bool debugIncludes;
  cmGeneratorExpression ge;
  vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  linkInterfaceIncludeDirectoriesEntries;
  undefined1 local_1f0 [32];
  long local_1d0;
  cmState *local_1c8;
  auto_ptr<cmCompiledGeneratorExpression> local_1c0;
  string libDir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  debugProperties;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  undefined8 local_168;
  hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  uniqueIncludes;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  cmGeneratorExpressionDAGChecker dagChecker;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c8 = (cmState *)lang;
  cmsys::
  hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  ::hashtable(&uniqueIncludes._M_ht,100,
              (hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&dagChecker,
              (equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&ge,(allocator_type *)&cge);
  pcVar1 = this->Target;
  ge.Backtrace.Context.Name._M_dataplus._M_p = (pointer)&ge.Backtrace.Context.Name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&ge,"INCLUDE_DIRECTORIES","");
  cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
            (&dagChecker,&pcVar1->Name,(string *)&ge,(GeneratorExpressionContent *)0x0,
             (cmGeneratorExpressionDAGChecker *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)ge.Backtrace.Context.Name._M_dataplus._M_p != &ge.Backtrace.Context.Name.field_2) {
    operator_delete(ge.Backtrace.Context.Name._M_dataplus._M_p,
                    CONCAT71(ge.Backtrace.Context.Name.field_2._M_allocated_capacity._1_7_,
                             ge.Backtrace.Context.Name.field_2._M_local_buf[0]) + 1);
  }
  debugProperties.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  debugProperties.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  debugProperties.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar2 = this->Makefile;
  ge.Backtrace.Context.Name._M_dataplus._M_p = (pointer)&ge.Backtrace.Context.Name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&ge,"CMAKE_DEBUG_TARGET_PROPERTIES","");
  __s = cmMakefile::GetDefinition(pcVar2,(string *)&ge);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)ge.Backtrace.Context.Name._M_dataplus._M_p != &ge.Backtrace.Context.Name.field_2) {
    operator_delete(ge.Backtrace.Context.Name._M_dataplus._M_p,
                    CONCAT71(ge.Backtrace.Context.Name.field_2._M_allocated_capacity._1_7_,
                             ge.Backtrace.Context.Name.field_2._M_local_buf[0]) + 1);
  }
  if (__s != (char *)0x0) {
    ge.Backtrace.Context.Name._M_dataplus._M_p = (pointer)&ge.Backtrace.Context.Name.field_2;
    sVar6 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&ge,__s,__s + sVar6);
    cmSystemTools::ExpandListArgument((string *)&ge,&debugProperties,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ge.Backtrace.Context.Name._M_dataplus._M_p != &ge.Backtrace.Context.Name.field_2) {
      operator_delete(ge.Backtrace.Context.Name._M_dataplus._M_p,
                      CONCAT71(ge.Backtrace.Context.Name.field_2._M_allocated_capacity._1_7_,
                               ge.Backtrace.Context.Name.field_2._M_local_buf[0]) + 1);
    }
  }
  if (this->DebugIncludesDone == false) {
    _Var7 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[20]>>
                      (debugProperties.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       debugProperties.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,"INCLUDE_DIRECTORIES");
    debugIncludes =
         _Var7._M_current !=
         debugProperties.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    debugIncludes = false;
  }
  paVar9 = &ge.Backtrace.Context.Name.field_2;
  if (this->GlobalGenerator->ConfigureDoneCMP0026AndCMP0024 == true) {
    this->DebugIncludesDone = true;
  }
  processIncludeDirectories
            (this,&this->IncludeDirectoriesEntries,__return_storage_ptr__,&uniqueIncludes,
             &dagChecker,config,debugIncludes,(string *)local_1c8);
  linkInterfaceIncludeDirectoriesEntries.
  super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  linkInterfaceIncludeDirectoriesEntries.
  super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  linkInterfaceIncludeDirectoriesEntries.
  super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ge.Backtrace.Context.Name._M_dataplus._M_p = (pointer)paVar9;
  std::__cxx11::string::_M_construct<char_const*>((string *)&ge,"INTERFACE_INCLUDE_DIRECTORIES","");
  AddInterfaceEntries(this,config,(string *)&ge,&linkInterfaceIncludeDirectoriesEntries);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)ge.Backtrace.Context.Name._M_dataplus._M_p != paVar9) {
    operator_delete(ge.Backtrace.Context.Name._M_dataplus._M_p,
                    CONCAT71(ge.Backtrace.Context.Name.field_2._M_allocated_capacity._1_7_,
                             ge.Backtrace.Context.Name.field_2._M_local_buf[0]) + 1);
  }
  pcVar2 = this->Makefile;
  ge.Backtrace.Context.Name._M_dataplus._M_p = (pointer)&ge.Backtrace.Context.Name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&ge,"APPLE","");
  bVar4 = cmMakefile::IsOn(pcVar2,(string *)&ge);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)ge.Backtrace.Context.Name._M_dataplus._M_p != &ge.Backtrace.Context.Name.field_2) {
    operator_delete(ge.Backtrace.Context.Name._M_dataplus._M_p,
                    CONCAT71(ge.Backtrace.Context.Name.field_2._M_allocated_capacity._1_7_,
                             ge.Backtrace.Context.Name.field_2._M_local_buf[0]) + 1);
  }
  if (bVar4) {
    pcVar8 = GetLinkImplementationLibrariesInternal(this,config,this);
    in_relative = (pcVar8->Libraries).
                  super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if (in_relative !=
        (pcVar8->Libraries).super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      do {
        cmsys::SystemTools::CollapseFullPath(&libDir,(string *)in_relative);
        if ((GetIncludeDirectories(std::__cxx11::string_const&,std::__cxx11::string_const&)::
             frameworkCheck == '\0') &&
           (iVar5 = __cxa_guard_acquire(&GetIncludeDirectories(std::__cxx11::string_const&,std::__cxx11::string_const&)
                                         ::frameworkCheck), iVar5 != 0)) {
          GetIncludeDirectories::frameworkCheck.program = (char *)0x0;
          cmsys::RegularExpression::compile
                    (&GetIncludeDirectories::frameworkCheck,
                     "(.*\\.framework)(/Versions/[^/]+)?/[^/]+$");
          __cxa_atexit(cmsys::RegularExpression::~RegularExpression,
                       &GetIncludeDirectories::frameworkCheck,&__dso_handle);
          __cxa_guard_release(&GetIncludeDirectories(std::__cxx11::string_const&,std::__cxx11::string_const&)
                               ::frameworkCheck);
        }
        bVar4 = cmsys::RegularExpression::find
                          (&GetIncludeDirectories::frameworkCheck,libDir._M_dataplus._M_p);
        if (bVar4) {
          if (GetIncludeDirectories::frameworkCheck.startp[1] == (char *)0x0) {
            ge.Backtrace.Context.Name._M_dataplus._M_p = (pointer)&ge.Backtrace.Context.Name.field_2
            ;
            ge.Backtrace.Context.Name._M_string_length = 0;
            ge.Backtrace.Context.Name.field_2._M_local_buf[0] = '\0';
          }
          else {
            ge.Backtrace.Context.Name._M_dataplus._M_p = (pointer)&ge.Backtrace.Context.Name.field_2
            ;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&ge,GetIncludeDirectories::frameworkCheck.startp[1],
                       GetIncludeDirectories::frameworkCheck.endp[1]);
          }
          std::__cxx11::string::operator=((string *)&libDir,(string *)&ge);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)ge.Backtrace.Context.Name._M_dataplus._M_p != &ge.Backtrace.Context.Name.field_2) {
            operator_delete(ge.Backtrace.Context.Name._M_dataplus._M_p,
                            CONCAT71(ge.Backtrace.Context.Name.field_2._M_allocated_capacity._1_7_,
                                     ge.Backtrace.Context.Name.field_2._M_local_buf[0]) + 1);
          }
          cmState::Snapshot::Snapshot((Snapshot *)&local_178,(cmState *)0x0);
          local_1f0._0_8_ = local_1f0 + 0x10;
          local_1f0._8_8_ = 0;
          local_1f0[0x10] = '\0';
          local_1d0 = 0;
          snapshot.Position.Tree = (cmLinkedTree<cmState::SnapshotDataType> *)local_178._8_8_;
          snapshot.State = (cmState *)local_178._M_allocated_capacity;
          snapshot.Position.Position._0_1_ = (char)local_168;
          snapshot.Position.Position._1_7_ = (int7)((ulong)local_168 >> 8);
          cmListFileBacktrace::cmListFileBacktrace
                    ((cmListFileBacktrace *)&cge,snapshot,(cmCommandContext *)local_1f0);
          cmGeneratorExpression::cmGeneratorExpression(&ge,(cmListFileBacktrace *)&cge);
          cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&cge);
          if ((cmCompiledGeneratorExpression *)local_1f0._0_8_ !=
              (cmCompiledGeneratorExpression *)(local_1f0 + 0x10)) {
            operator_delete((void *)local_1f0._0_8_,CONCAT71(local_1f0._17_7_,local_1f0[0x10]) + 1);
          }
          cmGeneratorExpression::Parse((cmGeneratorExpression *)local_1f0,(char *)&ge);
          cge.x_ = (cmCompiledGeneratorExpression *)local_1f0._0_8_;
          local_1f0._0_8_ = (pointer)0x0;
          cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
                    ((auto_ptr<cmCompiledGeneratorExpression> *)local_1f0);
          local_1f0._0_8_ = operator_new(0x10);
          aVar3 = cge;
          cge.x_ = (cmCompiledGeneratorExpression *)0x0;
          local_1c0.x_ = (cmCompiledGeneratorExpression *)0x0;
          (((TargetPropertyEntry *)local_1f0._0_8_)->ge).x_ = aVar3.x_;
          ((TargetPropertyEntry *)local_1f0._0_8_)->LinkImplItem =
               &TargetPropertyEntry::NoLinkImplItem;
          if (linkInterfaceIncludeDirectoriesEntries.
              super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              linkInterfaceIncludeDirectoriesEntries.
              super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<cmGeneratorTarget::TargetPropertyEntry*,std::allocator<cmGeneratorTarget::TargetPropertyEntry*>>
            ::_M_realloc_insert<cmGeneratorTarget::TargetPropertyEntry*>
                      ((vector<cmGeneratorTarget::TargetPropertyEntry*,std::allocator<cmGeneratorTarget::TargetPropertyEntry*>>
                        *)&linkInterfaceIncludeDirectoriesEntries,
                       (iterator)
                       linkInterfaceIncludeDirectoriesEntries.
                       super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish,(TargetPropertyEntry **)local_1f0)
            ;
          }
          else {
            *linkInterfaceIncludeDirectoriesEntries.
             super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
             ._M_impl.super__Vector_impl_data._M_finish = (TargetPropertyEntry *)local_1f0._0_8_;
            linkInterfaceIncludeDirectoriesEntries.
            super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 linkInterfaceIncludeDirectoriesEntries.
                 super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_1c0);
          cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&cge);
          cmGeneratorExpression::~cmGeneratorExpression(&ge);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)libDir._M_dataplus._M_p != &libDir.field_2) {
          operator_delete(libDir._M_dataplus._M_p,libDir.field_2._M_allocated_capacity + 1);
        }
        in_relative = in_relative + 1;
      } while (in_relative !=
               (pcVar8->Libraries).
               super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
  }
  processIncludeDirectories
            (this,&linkInterfaceIncludeDirectoriesEntries,__return_storage_ptr__,&uniqueIncludes,
             &dagChecker,config,debugIncludes,(string *)local_1c8);
  std::
  for_each<__gnu_cxx::__normal_iterator<cmGeneratorTarget::TargetPropertyEntry*const*,std::vector<cmGeneratorTarget::TargetPropertyEntry*,std::allocator<cmGeneratorTarget::TargetPropertyEntry*>>>,ContainerAlgorithms::DefaultDeleter<std::vector<cmGeneratorTarget::TargetPropertyEntry*,std::allocator<cmGeneratorTarget::TargetPropertyEntry*>>,false>>
            (linkInterfaceIncludeDirectoriesEntries.
             super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
             ._M_impl.super__Vector_impl_data._M_start,
             linkInterfaceIncludeDirectoriesEntries.
             super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  if (linkInterfaceIncludeDirectoriesEntries.
      super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(linkInterfaceIncludeDirectoriesEntries.
                    super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)linkInterfaceIncludeDirectoriesEntries.
                          super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)linkInterfaceIncludeDirectoriesEntries.
                          super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&debugProperties);
  cmListFileBacktrace::~cmListFileBacktrace(&dagChecker.Backtrace);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree(&dagChecker.Seen._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dagChecker.Property._M_dataplus._M_p != &dagChecker.Property.field_2) {
    operator_delete(dagChecker.Property._M_dataplus._M_p,
                    dagChecker.Property.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dagChecker.Target._M_dataplus._M_p != &dagChecker.Target.field_2) {
    operator_delete(dagChecker.Target._M_dataplus._M_p,
                    dagChecker.Target.field_2._M_allocated_capacity + 1);
  }
  cmsys::
  hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  ::~hashtable(&uniqueIncludes._M_ht);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string>
cmGeneratorTarget::GetIncludeDirectories(const std::string& config,
                                         const std::string& lang) const
{
  std::vector<std::string> includes;
  UNORDERED_SET<std::string> uniqueIncludes;

  cmGeneratorExpressionDAGChecker dagChecker(this->GetName(),
                                             "INCLUDE_DIRECTORIES", 0, 0);

  std::vector<std::string> debugProperties;
  const char *debugProp =
              this->Makefile->GetDefinition("CMAKE_DEBUG_TARGET_PROPERTIES");
  if (debugProp)
    {
    cmSystemTools::ExpandListArgument(debugProp, debugProperties);
    }

  bool debugIncludes = !this->DebugIncludesDone
                    && std::find(debugProperties.begin(),
                                 debugProperties.end(),
                                 "INCLUDE_DIRECTORIES")
                        != debugProperties.end();

  if (this->GlobalGenerator->GetConfigureDoneCMP0026())
    {
    this->DebugIncludesDone = true;
    }

  processIncludeDirectories(this,
                            this->IncludeDirectoriesEntries,
                            includes,
                            uniqueIncludes,
                            &dagChecker,
                            config,
                            debugIncludes,
                            lang);

  std::vector<cmGeneratorTarget::TargetPropertyEntry*>
    linkInterfaceIncludeDirectoriesEntries;
  AddInterfaceEntries(
    this, config, "INTERFACE_INCLUDE_DIRECTORIES",
    linkInterfaceIncludeDirectoriesEntries);

  if(this->Makefile->IsOn("APPLE"))
    {
    cmLinkImplementationLibraries const* impl =
        this->GetLinkImplementationLibraries(config);
    for(std::vector<cmLinkImplItem>::const_iterator
        it = impl->Libraries.begin();
        it != impl->Libraries.end(); ++it)
      {
      std::string libDir = cmSystemTools::CollapseFullPath(*it);

      static cmsys::RegularExpression
        frameworkCheck("(.*\\.framework)(/Versions/[^/]+)?/[^/]+$");
      if(!frameworkCheck.find(libDir))
        {
        continue;
        }

      libDir = frameworkCheck.match(1);

      cmGeneratorExpression ge;
      cmsys::auto_ptr<cmCompiledGeneratorExpression> cge =
                ge.Parse(libDir.c_str());
      linkInterfaceIncludeDirectoriesEntries
              .push_back(new cmGeneratorTarget::TargetPropertyEntry(cge));
      }
    }

  processIncludeDirectories(this,
                            linkInterfaceIncludeDirectoriesEntries,
                            includes,
                            uniqueIncludes,
                            &dagChecker,
                            config,
                            debugIncludes,
                            lang);

  cmDeleteAll(linkInterfaceIncludeDirectoriesEntries);

  return includes;
}